

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O3

Statement *
slang::ast::ProceduralAssignStatement::fromSyntax
          (Compilation *compilation,ProceduralAssignStatementSyntax *syntax,ASTContext *context)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ProceduralAssignStatement *stmt;
  Statement *pSVar4;
  DiagCode code;
  bool isForce;
  bool local_39;
  SourceRange local_38;
  Expression *pEVar3;
  
  local_39 = (syntax->keyword).kind == ForceKeyword;
  iVar2 = Expression::bind((int)(syntax->expr).ptr,(sockaddr *)context,
                           (uint)local_39 * 0x20000000 + 0x20000028);
  pEVar3 = (Expression *)CONCAT44(extraout_var,iVar2);
  local_38 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  stmt = BumpAllocator::
         emplace<slang::ast::ProceduralAssignStatement,slang::ast::Expression_const&,bool&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,pEVar3,&local_39,&local_38);
  bVar1 = Expression::bad(pEVar3);
  if (!bVar1) {
    if (pEVar3->kind != Assignment) {
      return &stmt->super_Statement;
    }
    pEVar3 = (Expression *)pEVar3[1].constant;
    if (local_39 == true) {
      bVar1 = isValidForceLVal(pEVar3,context,false);
      code.subsystem = Statements;
      code.code = 0x55;
    }
    else {
      bVar1 = isValidAssignLVal(pEVar3);
      code.subsystem = Statements;
      code.code = 4;
    }
    if (bVar1 != false) {
      return &stmt->super_Statement;
    }
    ASTContext::addDiag(context,code,pEVar3->sourceRange);
  }
  pSVar4 = Statement::badStmt(compilation,&stmt->super_Statement);
  return pSVar4;
}

Assistant:

Statement& ProceduralAssignStatement::fromSyntax(Compilation& compilation,
                                                 const ProceduralAssignStatementSyntax& syntax,
                                                 const ASTContext& context) {
    bool isForce = syntax.keyword.kind == TokenKind::ForceKeyword;
    bitmask<ASTFlags> astFlags = ASTFlags::NonProcedural | ASTFlags::AssignmentAllowed;
    if (isForce)
        astFlags |= ASTFlags::ProceduralForceRelease;
    else
        astFlags |= ASTFlags::ProceduralAssign;

    auto& assign = Expression::bind(*syntax.expr, context, astFlags);
    auto result = compilation.emplace<ProceduralAssignStatement>(assign, isForce,
                                                                 syntax.sourceRange());
    if (assign.bad())
        return badStmt(compilation, result);

    if (assign.kind == ExpressionKind::Assignment) {
        auto& lval = assign.as<AssignmentExpression>().left();
        if (isForce) {
            if (!isValidForceLVal(lval, context, false)) {
                context.addDiag(diag::BadProceduralForce, lval.sourceRange);
                return badStmt(compilation, result);
            }
        }
        else {
            if (!isValidAssignLVal(lval)) {
                context.addDiag(diag::BadProceduralAssign, lval.sourceRange);
                return badStmt(compilation, result);
            }
        }
    }

    return *result;
}